

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::SymlinkCommand::start
          (SymlinkCommand *this,BuildSystem *param_1,TaskInterface ti)

{
  bool bVar1;
  reference ppBVar2;
  BuildKey local_78;
  KeyType local_58;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  local_38;
  iterator ie;
  iterator it;
  BuildSystem *param_1_local;
  SymlinkCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (SymlinkCommand *)ti.impl;
  ie = std::
       vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ::begin(&(this->super_Command).inputs);
  local_38._M_current =
       (BuildNode **)
       std::
       vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ::end(&(this->super_Command).inputs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ie,&local_38);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&ie);
    llbuild::buildsystem::BuildKey::makeNode(&local_78,&(*ppBVar2)->super_Node);
    llbuild::buildsystem::BuildKey::toData(&local_58,&local_78);
    llbuild::core::TaskInterface::mustFollow((TaskInterface *)&this_local,&local_58);
    llbuild::core::KeyType::~KeyType(&local_58);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_78);
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&ie);
  }
  return;
}

Assistant:

virtual void start(BuildSystem&, TaskInterface ti) override {
    // The command itself takes no inputs, so just treat any declared inputs as
    // "must follow" directives.
    //
    // FIXME: We should make this explicit once we have actual support for must
    // follow inputs.
    for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it) {
      ti.mustFollow(BuildKey::makeNode(*it).toData());
    }
  }